

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::verifyImageData
          (TestStatus *__return_storage_ptr__,
          MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this,
          VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ConstPixelBufferAccess *local_28;
  ConstPixelBufferAccess *dataRS_local;
  VkImageCreateInfo *imageRSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this_local;
  
  local_28 = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)imageRSInfo;
  imageRSInfo_local = (VkImageCreateInfo *)this;
  this_local = (MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *)
               __return_storage_ptr__;
  bVar1 = checkForError(imageRSInfo,dataRS,0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Failed",&local_49);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Passed",&local_81);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceInterpolateScreenPosition>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	if (checkForError(imageRSInfo, dataRS, 0))
		return tcu::TestStatus::fail("Failed");

	return tcu::TestStatus::pass("Passed");
}